

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_load_fpr32(DisasContext_conflict6 *ctx,TCGv_i32 t,int reg)

{
  uintptr_t o;
  TCGv_i32 pTVar1;
  int in_ECX;
  undefined4 in_register_00000014;
  TCGContext_conflict6 *tcg_ctx;
  TCGTemp *local_38;
  TCGTemp *local_30;
  
  if (((uint)ctx >> 0x19 & 1) != 0) {
    pTVar1 = tcg_const_i32_mips64el((TCGContext_conflict6 *)t,0x14);
    local_38 = (TCGTemp *)(t + *(long *)(t + 0xa8f0));
    local_30 = (TCGTemp *)(pTVar1 + (long)t);
    tcg_gen_callN_mips64el
              ((TCGContext_conflict6 *)t,helper_raise_exception_mips64el,(TCGTemp *)0x0,2,&local_38)
    ;
    tcg_temp_free_internal_mips64el((TCGContext_conflict6 *)t,(TCGTemp *)(pTVar1 + (long)t));
  }
  tcg_gen_extrl_i64_i32_mips64el
            ((TCGContext_conflict6 *)t,(TCGv_i32)CONCAT44(in_register_00000014,reg),
             *(TCGv_i64 *)(t + (long)in_ECX * 8 + 0xb040));
  return;
}

Assistant:

static void gen_load_fpr32(DisasContext *ctx, TCGv_i32 t, int reg)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (ctx->hflags & MIPS_HFLAG_FRE) {
        generate_exception(ctx, EXCP_RI);
    }
    tcg_gen_extrl_i64_i32(tcg_ctx, t, tcg_ctx->fpu_f64[reg]);
}